

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
::swap(hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
       *this,hash_map_type *other)

{
  hash_map_type *other_local;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  *this_local;
  
  vector<crnlib::hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
  ::swap(&this->m_values,&other->m_values);
  std::swap<unsigned_int>(&this->m_hash_shift,&other->m_hash_shift);
  std::swap<unsigned_int>(&this->m_num_valid,&other->m_num_valid);
  std::swap<unsigned_int>(&this->m_grow_threshold,&other->m_grow_threshold);
  std::swap<crnlib::hasher<unsigned_int>>
            ((hasher<unsigned_int> *)&this->field_0x14,(hasher<unsigned_int> *)&other->field_0x14);
  std::swap<crnlib::equal_to<unsigned_int>>
            ((equal_to<unsigned_int> *)&this->field_0x15,
             (equal_to<unsigned_int> *)&other->field_0x15);
  return;
}

Assistant:

inline void swap(hash_map_type& other)
        {
            m_values.swap(other.m_values);
            std::swap(m_hash_shift, other.m_hash_shift);
            std::swap(m_num_valid, other.m_num_valid);
            std::swap(m_grow_threshold, other.m_grow_threshold);
            std::swap(m_hasher, other.m_hasher);
            std::swap(m_equals, other.m_equals);
        }